

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster-messages.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  basic_ifstream<char,_std::char_traits<char>_> *file_00;
  pointer this;
  reference __str;
  unsigned_long uVar5;
  reference pvVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  const_iterator __last;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  range_difference_t<const_std::vector<std::__cxx11::basic_string<char>_>_&> rVar7;
  reference pvVar8;
  variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  *pvVar9;
  range_difference_t<const_std::vector<std::__cxx11::basic_string<char>_>_&> rVar10;
  byte local_4a9;
  range_difference_t<const_std::vector<std::__cxx11::basic_string<char>_>_&> a2;
  key_type local_488;
  value_type_conflict1 local_480;
  ulong local_478;
  size_t j_1;
  value_type_conflict1 local_468;
  ulong local_460;
  size_t j;
  size_t i_1;
  opts_t r11;
  opts_t r8;
  range_difference_t<const_std::vector<std::__cxx11::basic_string<char>_>_&> a1;
  undefined1 local_3f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  value_type_conflict1 local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  value_type_conflict1 local_3a8;
  string local_3a0 [8];
  string token;
  size_t pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [8];
  string p;
  size_t to;
  size_t from;
  opts_t opts;
  unsigned_long local_2d0;
  unsigned_long i;
  size_t eq;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> l;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_298;
  const_iterator it;
  rules_t rules;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  basic_ifstream<char,_std::char_traits<char>_> *input;
  undefined1 local_228 [8];
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  file.super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>.
  super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
  super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
  super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._520_8_ = argv;
  if (argc == 2) {
    get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228,2,argv)
    ;
    bVar1 = std::holds_alternative<int,int,std::ifstream>
                      ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                       local_228);
    if (bVar1) {
      piVar4 = std::get<int,int,std::ifstream>
                         ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                          local_228);
      argv_local._4_4_ = *piVar4;
    }
    else {
      file_00 = std::get<std::ifstream,int,std::ifstream>
                          ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                           local_228);
      tokenize_abi_cxx11_<std::ifstream>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&rules._M_h._M_single_bucket,file_00);
      memset(&it,0,0x38);
      std::
      unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
      ::unordered_map((unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                       *)&it);
      local_298._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&rules._M_h._M_single_bucket);
      while( true ) {
        this = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator->(&local_298);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(this);
        local_4a9 = 0;
        if (!bVar1) {
          l.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&rules._M_h._M_single_bucket);
          bVar1 = __gnu_cxx::
                  operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            (&local_298,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&l.field_2 + 8));
          local_4a9 = bVar1 ^ 0xff;
        }
        if ((local_4a9 & 1) == 0) break;
        __str = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_298);
        std::__cxx11::string::string((string *)&eq,__str);
        i = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eq,':',
                       0);
        if (i != 0xffffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &opts.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eq,0,i);
          uVar5 = std::__cxx11::stoul((string *)
                                      &opts.
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (size_t *)0x0,10);
          std::__cxx11::string::~string
                    ((string *)
                     &opts.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_2d0 = uVar5;
          pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &eq,i + 2);
          if (*pvVar6 == '\"') {
            pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&eq,i + 3);
            pvVar9 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                      *)std::
                        unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                        ::operator[]((unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                      *)&it,&local_2d0);
            std::
            variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
            ::operator=(pvVar9,pvVar6);
          }
          else {
            memset(&from,0,0x18);
            std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)&from);
            to = i + 2;
            do {
              p.field_2._8_8_ =
                   std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eq,'|'
                        ,to);
              std::__cxx11::string::string((string *)local_338);
              if (p.field_2._8_8_ == -1) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(&local_358,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eq,to,
                       0xffffffffffffffff);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_338,&local_358);
                std::__cxx11::string::~string((string *)&local_358);
              }
              else {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eq,to,
                       ~to + p.field_2._8_8_);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_338,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pos)
                ;
                std::__cxx11::string::~string((string *)&pos);
                to = p.field_2._8_8_ + 2;
              }
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::emplace_back<>((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                *)&from);
              std::__cxx11::string::string(local_3a0);
              while (token.field_2._8_8_ =
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_338,' ',0), token.field_2._8_8_ != 0xffffffffffffffff)
              {
                pvVar8 = std::
                         vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ::back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)&from);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr(&local_3c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,0,token.field_2._8_8_);
                iVar2 = std::__cxx11::stoi(&local_3c8,(size_t *)0x0,10);
                local_3a8 = (value_type_conflict1)iVar2;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          (pvVar8,&local_3a8);
                std::__cxx11::string::~string((string *)&local_3c8);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338
                      ,0,token.field_2._8_8_ + 1);
              }
              pvVar8 = std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)&from);
              iVar2 = std::__cxx11::stoi((string *)local_338,(size_t *)0x0,10);
              local_3d0 = (value_type_conflict1)iVar2;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        (pvVar8,&local_3d0);
              if (p.field_2._8_8_ == -1) {
                input._0_4_ = 5;
              }
              else {
                input._0_4_ = 0;
              }
              std::__cxx11::string::~string(local_3a0);
              std::__cxx11::string::~string((string *)local_338);
            } while ((int)input == 0);
            pvVar9 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                      *)std::
                        unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                        ::operator[]((unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                      *)&it,&local_2d0);
            std::
            variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
            ::operator=(pvVar9,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                *)&from);
            std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)&from);
          }
        }
        std::__cxx11::string::~string((string *)&eq);
        messages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&local_298,0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3f0);
      __first = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator+(&local_298,1);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&rules._M_h._M_single_bucket);
      __result = std::
                 back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_3f0);
      std::ranges::__copy_fn::
      operator()<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ((__copy_fn *)&std::ranges::copy,__first,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__last._M_current,__result);
      rVar7 = validate((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3f0,(rules_t *)&it);
      poVar3 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar7);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      memset(&r11.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x18);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)&r11.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      memset(&i_1,0,0x18);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)&i_1);
      for (j = 0; j < 5; j = j + 1) {
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::emplace_back<>((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&r11.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::emplace_back<>((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&i_1);
        for (local_460 = 0; local_460 <= j; local_460 = local_460 + 1) {
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)&r11.
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,j);
          local_468 = 0x2a;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar8,&local_468);
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)&i_1,j);
          j_1 = 0x2a;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar8,&j_1);
        }
        for (local_478 = 0; local_478 <= j; local_478 = local_478 + 1) {
          pvVar8 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)&i_1,j);
          local_480 = 0x1f;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar8,&local_480);
        }
      }
      local_488 = 8;
      pvVar9 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                *)std::
                  unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                  ::operator[]((unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                *)&it,&local_488);
      std::
      variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
      ::operator=(pvVar9,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&r11.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      a2 = 0xb;
      pvVar9 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                *)std::
                  unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                  ::operator[]((unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                *)&it,(key_type *)&a2);
      std::
      variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
      ::operator=(pvVar9,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&i_1);
      rVar10 = validate((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3f0,(rules_t *)&it);
      poVar3 = std::operator<<((ostream *)&std::cout,"Part 2: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar10);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar7);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar10);
      std::operator<<(poVar3,"\n");
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&i_1);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&r11.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f0);
      std::
      unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
      ::~unordered_map((unordered_map<unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                        *)&it);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rules._M_h._M_single_bucket);
    }
    std::variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::~variant
              ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_228);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar3 = std::operator<<(poVar3,*(char **)file.
                                              super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                                              .
                                              super__Move_assign_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Copy_assign_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Move_ctor_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>
                                              .
                                              super__Variant_storage_alias<int,_std::basic_ifstream<char>_>
                                              ._520_8_);
    poVar3 = std::operator<<(poVar3," {path-to-file}");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto rules = rules_t {};
  auto it = tokens.cbegin();
  for (; !it->empty() && it != tokens.cend(); it++) {
    auto l = *it;
    size_t eq;
    if ((eq = l.find(':')) != std::string::npos) {
      auto i = std::stoul(l.substr(0, eq));
      if (l[eq+2] == '"') {
        rules[i] = l[eq+3];
      } else {
        auto opts = opts_t {};
        size_t from = eq+2;
        for(;;) {
          size_t to = l.find('|', from);
          std::string p;
          if (to == std::string::npos) {
            p = l.substr(from);
          } else {
            p = l.substr(from, to - from - 1);
            from = to + 2;
          }
          opts.emplace_back();

          size_t pos;
          std::string token;
          while ((pos = p.find(' ')) != std::string::npos) {
            opts.back().push_back(std::stoi(p.substr(0, pos)));
            p.erase(0, pos + 1);
          }
          opts.back().push_back(std::stoi(p));

          if (to == std::string::npos)
            break;
        }
        rules[i] = opts;
      }
    }
  }

  std::vector<std::string> messages;
  ranges::copy(it+1, tokens.cend(), std::back_inserter(messages));

  auto a1 = validate(messages, rules);

  // 170 too low, 185 too high, 184 correct
  std::cout << "Part 1: " << a1 << std::endl;

  // rule 8 encoded by (42|42 42|...|42 42 42 42 42)
  // rule 11 encoded by (42 31|42 42 31 31|...)
  auto r8 = opts_t {}, r11 = opts_t {};
  for (size_t i = 0; i < 5; i++) {
    r8.emplace_back();
    r11.emplace_back();
    for (size_t j = 0; j <= i; j++) {
      r8[i].push_back(42);
      r11[i].push_back(42);
    }
    for (size_t j = 0; j <= i; j++)
      r11[i].push_back(31);
  }

  rules[8] = r8;
  rules[11] = r11;

  auto a2 = validate(messages, rules);

  std::cout << "Part 2: " << a2 << std::endl;

  std::cout << a1 << "\n" << a2 << "\n";
}